

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_ToArrayLengthFree(JSContext *ctx,uint32_t *plen,JSValue val,BOOL is_array_ctor)

{
  int iVar1;
  JSValueUnion JVar2;
  int v;
  JSValueUnion JVar3;
  double d;
  JSValue JVar4;
  uint32_t len;
  uint32_t len1;
  
  JVar2 = val.u;
  if ((uint)val.tag < 3) {
    JVar3 = JVar2;
    if (val.u._0_4_ < 0) {
LAB_0011c784:
      JS_ThrowRangeError(ctx,"invalid array length");
      return -1;
    }
  }
  else if ((uint)val.tag == 7) {
    JVar3 = (JSValueUnion)(long)JVar2.float64;
    len = JVar3.int32;
    if (((double)((ulong)JVar3.ptr & 0xffffffff) != JVar2.float64) ||
       (NAN((double)((ulong)JVar3.ptr & 0xffffffff)) || NAN(JVar2.float64))) goto LAB_0011c784;
  }
  else if (is_array_ctor == 0) {
    iVar1 = JS_ToInt32(ctx,(int32_t *)&len,val);
    if (iVar1 != 0) {
      JS_FreeValue(ctx,val);
      return -1;
    }
    JVar4 = JS_ToNumberFree(ctx,val);
    if ((int)JVar4.tag == 6) {
      return -1;
    }
    iVar1 = JS_ToArrayLengthFree(ctx,&len1,JVar4,0);
    if (iVar1 != 0) {
      return -1;
    }
    JVar3._4_4_ = 0;
    JVar3.int32 = len1;
    if (len1 != len) goto LAB_0011c784;
  }
  else {
    JVar4 = JS_ToNumberFree(ctx,val);
    if ((int)JVar4.tag == 6) {
      return -1;
    }
    iVar1 = JS_ToArrayLengthFree(ctx,&len,JVar4,1);
    if (iVar1 != 0) {
      return -1;
    }
    JVar3._4_4_ = 0;
    JVar3.int32 = len;
  }
  *plen = JVar3.int32;
  return 0;
}

Assistant:

static __exception int JS_ToArrayLengthFree(JSContext *ctx, uint32_t *plen,
                                            JSValue val, BOOL is_array_ctor)
{
    uint32_t tag, len;

    tag = JS_VALUE_GET_TAG(val);
    switch(tag) {
    case JS_TAG_INT:
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
        {
            int v;
            v = JS_VALUE_GET_INT(val);
            if (v < 0)
                goto fail;
            len = v;
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
    case JS_TAG_BIG_FLOAT:
        {
            JSBigFloat *p = JS_VALUE_GET_PTR(val);
            bf_t a;
            BOOL res;
            bf_get_int32((int32_t *)&len, &p->num, BF_GET_INT_MOD);
            bf_init(ctx->bf_ctx, &a);
            bf_set_ui(&a, len);
            res = bf_cmp_eq(&a, &p->num);
            bf_delete(&a);
            JS_FreeValue(ctx, val);
            if (!res)
                goto fail;
        }
        break;
#endif
    default:
        if (JS_TAG_IS_FLOAT64(tag)) {
            double d;
            d = JS_VALUE_GET_FLOAT64(val);
            len = (uint32_t)d;
            if (len != d)
                goto fail;
        } else {
            uint32_t len1;

            if (is_array_ctor) {
                val = JS_ToNumberFree(ctx, val);
                if (JS_IsException(val))
                    return -1;
                /* cannot recurse because val is a number */
                if (JS_ToArrayLengthFree(ctx, &len, val, TRUE))
                    return -1;
            } else {
                /* legacy behavior: must do the conversion twice and compare */
                if (JS_ToUint32(ctx, &len, val)) {
                    JS_FreeValue(ctx, val);
                    return -1;
                }
                val = JS_ToNumberFree(ctx, val);
                if (JS_IsException(val))
                    return -1;
                /* cannot recurse because val is a number */
                if (JS_ToArrayLengthFree(ctx, &len1, val, FALSE))
                    return -1;
                if (len1 != len) {
                fail:
                    JS_ThrowRangeError(ctx, "invalid array length");
                    return -1;
                }
            }
        }
        break;
    }
    *plen = len;
    return 0;
}